

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::definedUnitsFromFile(string *filename)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  istream *piVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  string *measurement_string;
  string *in_RSI;
  string *in_RDI;
  precise_unit pVar8;
  precise_unit pVar9;
  precise_unit pVar10;
  exception *e;
  precise_measurement meas;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  size_type sloc;
  string userdef;
  int length;
  size_type sep;
  bool notfound;
  size_t esep;
  size_type commentloc;
  string line;
  ifstream infile;
  string *output;
  undefined7 in_stack_fffffffffffffaa8;
  char in_stack_fffffffffffffaaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac0;
  double in_stack_fffffffffffffac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb00;
  uint64_t in_stack_fffffffffffffc98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  int local_274;
  istream local_220 [527];
  byte local_11;
  string *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_fffffffffffffac0);
  std::ifstream::ifstream(local_220,local_10,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    std::operator+((char *)in_stack_fffffffffffffaf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0));
    std::operator+(in_stack_fffffffffffffab8,(char *)in_stack_fffffffffffffab0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    std::__cxx11::string::~string(in_stack_fffffffffffffab0);
    std::__cxx11::string::~string(in_stack_fffffffffffffab0);
    local_11 = 1;
    local_274 = 1;
  }
  else {
    std::__cxx11::string::string(in_stack_fffffffffffffac0);
    pVar9._8_8_ = in_stack_fffffffffffffac0;
    pVar9.multiplier_ = in_stack_fffffffffffffac8;
    pVar10._8_8_ = in_stack_fffffffffffffab0;
    pVar10.multiplier_ = (double)in_stack_fffffffffffffab8;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_220,(string *)&local_298);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
      if (!bVar3) break;
      sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of(in_stack_fffffffffffffad0,(char *)pVar9.multiplier_,pVar9._8_8_);
      if (sVar5 != 0xffffffffffffffff) {
        pvVar6 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                           (pVar10._8_8_,
                            CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
        if (*pvVar6 != '#') {
          pvVar6 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                             (pVar10._8_8_,
                              CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
          if ((*pvVar6 == '\"') ||
             (pvVar6 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (pVar10._8_8_,
                                  CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8)),
             *pvVar6 == '\'')) {
            bVar3 = true;
            while (bVar3) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator[](pVar10._8_8_,CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8))
              ;
              sVar5 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                      find_first_of(pVar10._8_8_,in_stack_fffffffffffffaaf,0x6ccf36);
              if (sVar5 == 0xffffffffffffffff) break;
              pvVar6 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (pVar10._8_8_,
                                  CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
              if (*pvVar6 == '\\') {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::erase(pVar9._8_8_,(size_type)pVar10.multiplier_,pVar10._8_8_);
              }
              else {
                bVar3 = false;
              }
            }
          }
          sVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_first_of
                            (in_stack_fffffffffffffad0,(char *)pVar9.multiplier_,pVar9._8_8_);
          if (sVar5 == 0xffffffffffffffff) {
            std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator+=(pVar10._8_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
            std::__cxx11::string::~string(pVar10._8_8_);
          }
          else {
            sVar7 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (&local_298);
            if (sVar5 == sVar7 - 1) {
              std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(pVar10._8_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
              std::__cxx11::string::~string(pVar10._8_8_);
            }
            bVar3 = false;
            pvVar6 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                               (pVar10._8_8_,
                                CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
            if ((*pvVar6 == '=') ||
               (pvVar6 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](pVar10._8_8_,
                                    CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8)),
               *pvVar6 == '>')) {
              bVar3 = true;
            }
            if (!bVar3) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator[](pVar10._8_8_,CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8))
              ;
            }
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pVar9.multiplier_,pVar9._8_8_,(size_type)pVar10.multiplier_);
            while( true ) {
              pvVar6 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                 (pVar10._8_8_);
              if (*pvVar6 != ' ') break;
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              pop_back(pVar10._8_8_);
            }
            pvVar6 = CLI::std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                               (pVar10._8_8_);
            if ((*pvVar6 == '\"') ||
               (pvVar6 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                   (pVar10._8_8_), *pvVar6 == '\'')) {
              pvVar6 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                 (pVar10._8_8_);
              cVar1 = *pvVar6;
              pvVar6 = CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                 (pVar10._8_8_);
              if (cVar1 == *pvVar6) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back(pVar10._8_8_);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                __normal_iterator<char*>
                          (pVar10._8_8_,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(pVar9._8_8_,(char *)pVar9.multiplier_);
              }
            }
            bVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x6cd31e);
            if (bVar3) {
              std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              operator+=(pVar10._8_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
              std::__cxx11::string::~string(pVar10._8_8_);
              local_274 = 2;
            }
            else {
              measurement_string =
                   (string *)
                   CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find_first_not_of(in_stack_fffffffffffffad0,(char *)pVar9.multiplier_,pVar9._8_8_
                                    );
              if (measurement_string == (string *)0xffffffffffffffff) {
                std::operator+(in_stack_fffffffffffffad8,(char *)in_stack_fffffffffffffad0);
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::operator+=(pVar10._8_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                std::__cxx11::string::~string(pVar10._8_8_);
                local_274 = 2;
              }
              else {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pVar9.multiplier_,pVar9._8_8_,(size_type)pVar10.multiplier_);
                while( true ) {
                  pvVar6 = CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                     (pVar10._8_8_);
                  if (*pvVar6 != ' ') break;
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                            (pVar10._8_8_);
                }
                pvVar6 = CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                   (pVar10._8_8_);
                if ((*pvVar6 == '\"') ||
                   (pvVar6 = CLI::std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                             front(pVar10._8_8_), *pvVar6 == '\'')) {
                  pvVar6 = CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::back
                                     (pVar10._8_8_);
                  cVar1 = *pvVar6;
                  pvVar6 = CLI::std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::front
                                     (pVar10._8_8_);
                  if (cVar1 == *pvVar6) {
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                              (pVar10._8_8_);
                    CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::
                    __normal_iterator<char*>
                              (pVar10._8_8_,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::erase(pVar9._8_8_,(char *)pVar9.multiplier_);
                  }
                }
                std::__cxx11::string::string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                           in_stack_fffffffffffffae8);
                getDefaultFlags();
                measurement_from_string(measurement_string,in_stack_fffffffffffffc98);
                std::__cxx11::string::~string(pVar10._8_8_);
                in_stack_fffffffffffffaf7 =
                     is_valid((precise_measurement *)in_stack_fffffffffffffad0);
                if ((bool)in_stack_fffffffffffffaf7) {
                  in_stack_fffffffffffffae8 =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CLI::std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                 (pVar10._8_8_,
                                  CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                  if (*(char *)&(in_stack_fffffffffffffae8->_M_dataplus)._M_p == '>') {
                    pVar8 = precise_measurement::as_unit((precise_measurement *)0x6cd70e);
                    in_stack_fffffffffffffad8 = pVar8._8_8_;
                    addUserDefinedInputUnit
                              (pVar10._8_8_,
                               (precise_unit *)
                               CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                  }
                  else {
                    in_stack_fffffffffffffad0 =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CLI::std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                         operator[](pVar10._8_8_,
                                    CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                    if (*(char *)&(in_stack_fffffffffffffad0->_M_dataplus)._M_p == '<') {
                      pVar9 = precise_measurement::as_unit((precise_measurement *)0x6cd789);
                      addUserDefinedOutputUnit(pVar9._8_8_,(precise_unit *)pVar10.multiplier_);
                    }
                    else {
                      pVar10 = precise_measurement::as_unit((precise_measurement *)0x6cd7d8);
                      addUserDefinedUnit(pVar9._8_8_,(precise_unit *)pVar10.multiplier_);
                    }
                  }
                  local_274 = 0;
                }
                else {
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pVar9.multiplier_,pVar9._8_8_,(size_type)pVar10.multiplier_);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pVar10.multiplier_,pVar10._8_8_);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                            (pVar10._8_8_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffffaaf,in_stack_fffffffffffffaa8));
                  std::__cxx11::string::~string(pVar10._8_8_);
                  std::__cxx11::string::~string(pVar10._8_8_);
                  local_274 = 2;
                }
                std::__cxx11::string::~string(pVar10._8_8_);
              }
            }
            std::__cxx11::string::~string(pVar10._8_8_);
          }
        }
      }
    }
    std::__cxx11::string::~string(pVar10._8_8_);
    in_stack_fffffffffffffab0 = pVar10._8_8_;
    local_274 = 0;
  }
  std::ifstream::~ifstream(local_220);
  if (local_274 == 0) {
    local_11 = 1;
    local_274 = 1;
  }
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string(in_stack_fffffffffffffab0);
  }
  return in_RDI;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}